

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelAnalyzerResults.cpp
# Opt level: O1

void __thiscall
SimpleParallelAnalyzerResults::GenerateExportFile
          (SimpleParallelAnalyzerResults *this,char *file,DisplayBase display_base,
          U32 export_type_user_id)

{
  bool bVar1;
  char cVar2;
  char cVar3;
  uint uVar4;
  void *pvVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  Frame frame;
  stringstream ss;
  char number_str [128];
  char time_str [128];
  uchar *local_338;
  uchar local_328 [16];
  ulonglong local_318;
  ulong local_310;
  undefined1 *local_308;
  uint local_300;
  undefined1 local_2f8 [16];
  ulonglong local_2e8 [2];
  ulonglong local_2d8;
  stringstream local_2c0 [16];
  long local_2b0;
  string local_2a8 [104];
  ios_base local_240 [264];
  char local_138 [128];
  char local_b8 [136];
  
  std::__cxx11::stringstream::stringstream(local_2c0);
  pvVar5 = (void *)AnalyzerHelpers::StartFile(file,false);
  local_318 = Analyzer::GetTriggerSample();
  uVar4 = Analyzer::GetSampleRate();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b0,"Time [s],Value",0xe);
  cVar2 = (char)(ostream *)&local_2b0;
  std::ios::widen((char)*(undefined8 *)(local_2b0 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  uVar6 = AnalyzerResults::GetNumFrames();
  if (uVar6 != 0) {
    uVar8 = 0;
    uVar9 = 1;
    do {
      local_310 = uVar8;
      AnalyzerResults::GetFrame((ulonglong)local_2e8);
      AnalyzerHelpers::GetTimeString(local_2e8[0],local_318,uVar4,local_b8,0x80);
      AnalyzerHelpers::GetNumberString(local_2d8,display_base,0x10,local_138,0x80);
      sVar7 = strlen(local_b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b0,local_b8,sVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b0,",",1);
      sVar7 = strlen(local_138);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b0,local_138,sVar7);
      std::ios::widen((char)*(undefined8 *)(local_2b0 + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringbuf::str();
      AnalyzerHelpers::AppendToFile(local_338,local_300,pvVar5);
      if (local_308 != local_2f8) {
        operator_delete(local_308);
      }
      if (local_338 != local_328) {
        operator_delete(local_338);
      }
      local_328[0] = '\0';
      std::__cxx11::stringbuf::str(local_2a8);
      cVar3 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,local_310);
      if (cVar3 == '\0') {
        Frame::~Frame((Frame *)local_2e8);
      }
      else {
        AnalyzerHelpers::EndFile(pvVar5);
        Frame::~Frame((Frame *)local_2e8);
        if (cVar3 != '\0') goto LAB_00106e2c;
      }
      bVar1 = uVar9 < uVar6;
      uVar8 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
      local_338 = local_328;
    } while (bVar1);
  }
  AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar6);
  AnalyzerHelpers::EndFile(pvVar5);
LAB_00106e2c:
  std::__cxx11::stringstream::~stringstream(local_2c0);
  std::ios_base::~ios_base(local_240);
  return;
}

Assistant:

void SimpleParallelAnalyzerResults::GenerateExportFile( const char* file, DisplayBase display_base, U32 export_type_user_id )
{
    std::stringstream ss;
    void* f = AnalyzerHelpers::StartFile( file );

    U64 trigger_sample = mAnalyzer->GetTriggerSample();
    U32 sample_rate = mAnalyzer->GetSampleRate();

    ss << "Time [s],Value" << std::endl;

    U64 num_frames = GetNumFrames();
    for( U32 i = 0; i < num_frames; i++ )
    {
        Frame frame = GetFrame( i );

        char time_str[ 128 ];
        AnalyzerHelpers::GetTimeString( frame.mStartingSampleInclusive, trigger_sample, sample_rate, time_str, 128 );

        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 16, number_str, 128 );

        ss << time_str << "," << number_str << std::endl;

        AnalyzerHelpers::AppendToFile( ( U8* )ss.str().c_str(), ss.str().length(), f );
        ss.str( std::string() );

        if( UpdateExportProgressAndCheckForCancel( i, num_frames ) == true )
        {
            AnalyzerHelpers::EndFile( f );
            return;
        }
    }

    UpdateExportProgressAndCheckForCancel( num_frames, num_frames );
    AnalyzerHelpers::EndFile( f );
}